

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_10,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int in_ECX;
  float *pfVar2;
  undefined4 in_register_00000014;
  ShaderEvalContext *extraout_RDX;
  ShaderEvalContext *extraout_RDX_00;
  ShaderEvalContext *evalCtx_00;
  long lVar3;
  long lVar4;
  float *this;
  Type in1;
  Type in0;
  Matrix<float,_4,_3> retVal;
  MatrixCaseUtils local_cc [12];
  Mat3x4 local_c0;
  Mat3x4 local_90;
  VecAccess<float,_4,_3> local_60;
  Mat3x4 local_48;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,10>
              (&local_90,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    evalCtx_00 = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_4,_3>::Matrix(&local_90,(float *)sr::(anonymous_namespace)::s_constInMat3x4);
    evalCtx_00 = extraout_RDX_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,10>
              (&local_c0,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_3>::Matrix
              (&local_c0,(float *)(sr::(anonymous_namespace)::s_constInMat3x4 + 0x30));
  }
  this = (float *)&local_48;
  tcu::Matrix<float,_4,_3>::Matrix((Matrix<float,_4,_3> *)this);
  pfVar1 = (float *)&local_c0;
  pfVar2 = (float *)&local_90;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 0x10) {
      *(float *)((long)this + lVar4) =
           *(float *)((long)pfVar2 + lVar4) * *(float *)((long)pfVar1 + lVar4);
    }
    this = this + 1;
    pfVar1 = pfVar1 + 1;
    pfVar2 = pfVar2 + 1;
  }
  reduceToVec3(local_cc,&local_48);
  local_60.m_vector = &evalCtx->color;
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_60,(Vector<float,_3> *)local_cc);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}